

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilEnum.c
# Opt level: O0

void Abc_EnumerateFunctions(int nDecMax)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  word *p_01;
  abctime aVar5;
  word *pHash;
  Vec_Int_t *vTruths;
  Vec_Int_t *vGates;
  abctime clk;
  int v;
  int b;
  int a;
  int n;
  int k;
  int i;
  int GateCount [100];
  int local_66c;
  int local_668;
  int nFuncDone;
  int FuncDone [100];
  uint local_4c8;
  uint Truth;
  uint pFuncs [100];
  uint pMints [100];
  uint pVars [100];
  int nFuncs;
  int nMints;
  int nVars;
  int nDecMax_local;
  
  nMints = nDecMax;
  memset(pMints + 0x62,0,400);
  memset(pFuncs + 0x62,0,400);
  memset(&local_4c8,0,400);
  memset(&local_668,0,400);
  local_66c = 0;
  memset(&k,0,400);
  aVar4 = Abc_Clock();
  p = Vec_IntAlloc(100000);
  p_00 = Vec_IntAlloc(100000);
  Abc_GetSecond(&nFuncs,(int *)(pVars + 99),(int *)(pVars + 0x62),pMints + 0x62,pFuncs + 0x62,
                &local_4c8);
  if ((pVars[99] != 0x10) && (pVars[99] != 0x20)) {
    __assert_fail("nMints == 16 || nMints == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                  ,0x153,"void Abc_EnumerateFunctions(int)");
  }
  p_01 = (word *)calloc((long)(1 << ((char)pVars[99] - 3U & 0x1f)),1);
  for (a = 0; a < nFuncs; a = a + 1) {
    Abc_DataXorBit(p_01,(ulong)pMints[(long)a + 0x62]);
    Vec_IntPush(p_00,pMints[(long)a + 0x62]);
    Vec_IntPush(p,-1);
    Vec_IntPush(p,-1);
  }
  k = 0;
  i = nFuncs;
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 == nFuncs) {
    for (b = 0; b < nMints && local_66c < (int)pVars[0x62]; b = b + 1) {
      for (v = 0; v <= b; v = v + 1) {
        for (clk._4_4_ = v; (int)clk._4_4_ <= b; clk._4_4_ = clk._4_4_ + 1) {
          if (v + clk._4_4_ == b) {
            printf("Trying %d + %d + 1 = %d\n",(ulong)(uint)v,(ulong)clk._4_4_,(ulong)(b + 1));
            for (n = (&k)[v]; n < (&k)[v + 1]; n = n + 1) {
              for (a = (&k)[(int)clk._4_4_]; a < (&k)[(int)(clk._4_4_ + 1)]; a = a + 1) {
                if (n < a) {
                  uVar2 = Vec_IntEntry(p_00,n);
                  uVar3 = Vec_IntEntry(p_00,a);
                  uVar2 = uVar2 & uVar3;
                  iVar1 = Abc_DataHasBit(p_01,(ulong)uVar2);
                  if (iVar1 == 0) {
                    Abc_DataXorBit(p_01,(ulong)uVar2);
                    Vec_IntPush(p_00,uVar2);
                    Vec_IntPush(p,n);
                    Vec_IntPush(p,a);
                    for (clk._0_4_ = 0; (int)(uint)clk < (int)pVars[0x62]; clk._0_4_ = (uint)clk + 1
                        ) {
                      if (((&local_668)[(int)(uint)clk] == 0) &&
                         (uVar2 == (&local_4c8)[(int)(uint)clk])) {
                        printf("Found function %d with %d gates: ",(ulong)(uint)clk,(ulong)(b + 1));
                        iVar1 = Vec_IntSize(p_00);
                        Abc_EnumPrint(p,iVar1 + -1,nFuncs);
                        (&local_668)[(int)(uint)clk] = 1;
                        local_66c = local_66c + 1;
                      }
                    }
                  }
                  uVar2 = Vec_IntEntry(p_00,n);
                  uVar3 = Vec_IntEntry(p_00,a);
                  uVar2 = uVar2 | uVar3;
                  iVar1 = Abc_DataHasBit(p_01,(ulong)uVar2);
                  if (iVar1 == 0) {
                    Abc_DataXorBit(p_01,(ulong)uVar2);
                    Vec_IntPush(p_00,uVar2);
                    Vec_IntPush(p,a);
                    Vec_IntPush(p,n);
                    for (clk._0_4_ = 0; (int)(uint)clk < (int)pVars[0x62]; clk._0_4_ = (uint)clk + 1
                        ) {
                      if (((&local_668)[(int)(uint)clk] == 0) &&
                         (uVar2 == (&local_4c8)[(int)(uint)clk])) {
                        printf("Found function %d with %d gates: ",(ulong)(uint)clk,(ulong)(b + 1));
                        iVar1 = Vec_IntSize(p_00);
                        Abc_EnumPrint(p,iVar1 + -1,nFuncs);
                        (&local_668)[(int)(uint)clk] = 1;
                        local_66c = local_66c + 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar1 = Vec_IntSize(p_00);
      (&k)[b + 2] = iVar1;
      uVar3 = Vec_IntSize(p_00);
      printf("Finished %d gates.  Truths = %10d.  ",(ulong)(b + 1),(ulong)uVar3);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    if (p_01 != (word *)0x0) {
      free(p_01);
    }
    Vec_IntFree(p);
    Vec_IntFree(p_00);
    return;
  }
  __assert_fail("Vec_IntSize(vTruths) == nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilEnum.c"
                ,0x163,"void Abc_EnumerateFunctions(int)");
}

Assistant:

void Abc_EnumerateFunctions( int nDecMax )
{
    int nVars;
    int nMints;
    int nFuncs;
    unsigned pVars[100] = {0};
    unsigned pMints[100] = {0};
    unsigned pFuncs[100] = {0};
    unsigned Truth;
    int FuncDone[100] = {0}, nFuncDone = 0;
    int GateCount[100] = {0};
    int i, k, n, a, b, v;
    abctime clk = Abc_Clock();
    Vec_Int_t * vGates = Vec_IntAlloc( 100000 );
    Vec_Int_t * vTruths = Vec_IntAlloc( 100000 );
//    Vec_Int_t * vHash = Vec_IntStartFull( 1 << 16 );
    word * pHash;

    // extract data
//    Abc_GetFirst( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
    Abc_GetSecond( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );
//    Abc_GetThird( &nVars, &nMints, &nFuncs, pVars, pMints, pFuncs );

    // create hash table
    assert( nMints == 16 || nMints == 32 );
    pHash = (word *)ABC_CALLOC( char, 1 << (nMints-3) );

    // create elementary gates
    for ( k = 0; k < nVars; k++ )
    {
//        Vec_IntWriteEntry( vHash, pVars[k], k );
        Abc_DataXorBit( pHash, pVars[k] );
        Vec_IntPush( vTruths, pVars[k] );
        Vec_IntPush( vGates, -1 );
        Vec_IntPush( vGates, -1 );
    }

    // go through different number of variables
    GateCount[0] = 0;
    GateCount[1] = nVars;
    assert( Vec_IntSize(vTruths) == nVars );
    for ( n = 0; n < nDecMax && nFuncDone < nFuncs; n++ )
    {
        for ( a = 0; a <= n; a++ )
        for ( b = a; b <= n; b++ )
        if ( a + b == n )
        {
            printf( "Trying %d + %d + 1 = %d\n", a, b, n+1 );
            for ( i = GateCount[a]; i < GateCount[a+1]; i++ )
            for ( k = GateCount[b]; k < GateCount[b+1]; k++ )
            if ( i < k )
            {
                Truth = Vec_IntEntry(vTruths, i) & Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, i );
                    Vec_IntPush( vGates, k );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
                Truth = Vec_IntEntry(vTruths, i) | Vec_IntEntry(vTruths, k);
//                if ( Vec_IntEntry(vHash, Truth) == -1 )
                if ( !Abc_DataHasBit(pHash, Truth) )
                {
//                    Vec_IntWriteEntry( vHash, Truth, Vec_IntSize(vTruths) );
                    Abc_DataXorBit( pHash, Truth );
                    Vec_IntPush( vTruths, Truth );
                    Vec_IntPush( vGates, k );
                    Vec_IntPush( vGates, i );

                    for ( v = 0; v < nFuncs; v++ )
                    if ( !FuncDone[v] && Truth == pFuncs[v] )
                    {
                        printf( "Found function %d with %d gates: ", v, n+1 );
                        Abc_EnumPrint( vGates, Vec_IntSize(vTruths)-1, nVars );
                        FuncDone[v] = 1;
                        nFuncDone++;
                    }
                }
            }
        }
        GateCount[n+2] = Vec_IntSize(vTruths);
        printf( "Finished %d gates.  Truths = %10d.  ", n+1, Vec_IntSize(vTruths) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    ABC_FREE( pHash );
//    Vec_IntFree( vHash );
    Vec_IntFree( vGates );
    Vec_IntFree( vTruths );
}